

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<double> * __thiscall
tinyusdz::primvar::PrimVar::get_ts_time
          (optional<double> *__return_storage_ptr__,PrimVar *this,size_t idx)

{
  long lVar1;
  optional<double> local_20;
  
  lVar1 = (long)(this->_ts)._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_ts)._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((lVar1 == 0) || ((ulong)(lVar1 / 0x28) <= idx)) {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<double>)0x0;
  }
  else {
    tinyusdz::value::TimeSamples::get_time(&local_20,&this->_ts,idx);
    __return_storage_ptr__->has_value_ = local_20.has_value_;
    if (local_20.has_value_ == true) {
      __return_storage_ptr__->contained = local_20.contained;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<double> get_ts_time(size_t idx) const {

    if (!has_timesamples()) {
      return nonstd::nullopt;
    }

    if (idx >= _ts.size()) {
      return nonstd::nullopt;
    }

    return _ts.get_time(idx);
  }